

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::AnnotatedHandler::gatherForEncode
          (AnnotatedHandler *this,JsonCodec *codec,Reader *input,StringPtr prefix,
          StringPtr morePrefix,
          Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *flattenedFields)

{
  ushort uVar1;
  AnnotatedHandler *pAVar2;
  RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *pRVar3;
  RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *pRVar4;
  ArrayPtr<const_char> AVar5;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  StringPtr prefix_00;
  StringPtr prefix_01;
  StringPtr prefix_02;
  RawBrandedSchema *pRVar6;
  Schema SVar7;
  ArrayDisposer *pAVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  ArrayPtr<const_char> *params_1;
  FieldInfo *pFVar12;
  size_t sVar13;
  size_t sVar14;
  char *ptrCopy;
  ulong uVar15;
  ulong uVar16;
  StringPtr prefix_03;
  StringPtr prefix_04;
  Type TVar17;
  Field field;
  String ownPrefix;
  NullableValue<capnp::StructSchema::Field> _which1269;
  StructSchema schema;
  ReaderFor<capnp::DynamicStruct> reader;
  RawBrandedSchema *local_450;
  ArrayPtr<const_char> local_418;
  StructReader local_408;
  RawBrandedSchema *local_3d8;
  Schema SStack_3d0;
  ArrayDisposer *local_3c8;
  undefined1 local_3b8 [48];
  anon_union_64_1_a8a2e026_for_OneOf<capnp::StructSchema::Field,_capnp::Type>_2 aStack_388;
  Reader local_348;
  RawBrandedSchema *local_300;
  undefined1 local_2f8 [16];
  ArrayDisposer *pAStack_2e8;
  SegmentReader *local_2e0;
  CapTableReader *pCStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  uint16_t *local_2c0;
  ulong uStack_2b8;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_2b0;
  Schema local_268;
  ReaderFor<DynamicStruct> local_260;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_228;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_1e0;
  Reader local_198;
  Reader local_150;
  Reader local_108;
  Reader local_c0;
  Reader local_78;
  
  sVar14 = prefix.content.size_;
  local_450 = (RawBrandedSchema *)prefix.content.ptr;
  local_3d8 = (RawBrandedSchema *)0x0;
  SStack_3d0.raw = (RawBrandedSchema *)0x0;
  local_3c8 = (ArrayDisposer *)0x0;
  params_1 = (ArrayPtr<const_char> *)(morePrefix.content.size_ - 1);
  if (params_1 != (ArrayPtr<const_char> *)0x0) {
    if ((RawBrandedSchema *)(sVar14 - 1) == (RawBrandedSchema *)0x0) {
      local_450 = (RawBrandedSchema *)morePrefix.content.ptr;
      sVar14 = morePrefix.content.size_;
    }
    else {
      local_418.ptr = morePrefix.content.ptr;
      local_418.size_ = (size_t)params_1;
      local_2f8._0_8_ = local_450;
      local_2f8._8_8_ = (RawBrandedSchema *)(sVar14 - 1);
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)local_3b8,(_ *)local_2f8,&local_418,params_1);
      local_3d8 = (RawBrandedSchema *)local_3b8._0_8_;
      SStack_3d0.raw = (RawBrandedSchema *)local_3b8._8_8_;
      local_3c8 = (ArrayDisposer *)local_3b8._16_8_;
      local_450 = (RawBrandedSchema *)0x524569;
      if ((Schema)local_3b8._8_8_ != (Schema)0x0) {
        local_450 = (RawBrandedSchema *)local_3b8._0_8_;
      }
      sVar14 = local_3b8._8_8_ + (ulong)((Schema)local_3b8._8_8_ == (Schema)0x0);
    }
  }
  pAVar8 = local_3c8;
  SVar7.raw = SStack_3d0.raw;
  pRVar6 = local_3d8;
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_260,input);
  local_268 = local_260.schema.super_Schema.raw;
  local_300 = pRVar6;
  StructSchema::getNonUnionFields((FieldSubset *)local_2f8,(StructSchema *)&local_268);
  uVar15 = uStack_2b8 & 0xffffffff;
  if (uVar15 != 0) {
    uVar16 = 0;
    do {
      uVar9 = local_2f8._0_8_;
      uVar1 = local_2c0[uVar16];
      capnp::_::ListReader::getStructElement(&local_408,(ListReader *)(local_2f8 + 8),(uint)uVar1);
      local_418.ptr = (char *)uVar9;
      local_418.size_ = CONCAT44(local_418.size_._4_4_,(uint)uVar1);
      pFVar12 = (this->fields).ptr + (uint)uVar1;
      field_00._8_8_ = local_418.size_;
      field_00.parent.super_Schema.raw = (Schema)(Schema)uVar9;
      field_00.proto._reader.segment = local_408.segment;
      field_00.proto._reader.capTable = local_408.capTable;
      field_00.proto._reader.data = local_408.data;
      field_00.proto._reader.pointers = local_408.pointers;
      field_00.proto._reader.dataSize = local_408.dataSize;
      field_00.proto._reader.pointerCount = local_408.pointerCount;
      field_00.proto._reader._38_2_ = local_408._38_2_;
      field_00.proto._reader.nestingLimit = local_408.nestingLimit;
      field_00.proto._reader._44_4_ = local_408._44_4_;
      bVar11 = DynamicStruct::Reader::has(&local_260,field_00,((codec->impl).ptr)->hasMode);
      if (bVar11) {
        pAVar2 = (pFVar12->flattenHandler).ptr;
        if (pAVar2 == (AnnotatedHandler *)0x0) {
          AVar5 = (pFVar12->name).content;
          local_228.tag = 1;
          local_228.field_1._48_4_ = local_408.dataSize;
          local_228.field_1._52_2_ = local_408.pointerCount;
          local_228.field_1._54_2_ = local_408._38_2_;
          local_228.field_1._56_8_ = local_408._40_8_;
          local_228.field_1._32_8_ = local_408.data;
          local_228.field_1._40_8_ = local_408.pointers;
          local_228.field_1._16_8_ = local_408.segment;
          local_228.field_1._24_8_ = local_408.capTable;
          local_228.field_1._0_8_ = local_418.ptr;
          local_228.field_1._8_8_ = local_418.size_;
          field_02._8_8_ = local_418.size_;
          field_02.parent.super_Schema.raw = (Schema)(Schema)local_418.ptr;
          field_02.proto._reader.segment = local_408.segment;
          field_02.proto._reader.capTable = local_408.capTable;
          field_02.proto._reader.data = local_408.data;
          field_02.proto._reader.pointers = local_408.pointers;
          field_02.proto._reader.dataSize = local_408.dataSize;
          field_02.proto._reader.pointerCount = local_408.pointerCount;
          field_02.proto._reader._38_2_ = local_408._38_2_;
          field_02.proto._reader.nestingLimit = local_408.nestingLimit;
          field_02.proto._reader._44_4_ = local_408._44_4_;
          DynamicStruct::Reader::get(&local_c0,&local_260,field_02);
          prefix_00.content.size_ = sVar14;
          prefix_00.content.ptr = (char *)local_450;
          FlattenedField::FlattenedField
                    ((FlattenedField *)local_3b8,prefix_00,(StringPtr)AVar5,&local_228,&local_c0);
          pRVar3 = (flattenedFields->builder).pos;
          if (pRVar3 == (flattenedFields->builder).endPtr) {
            pRVar4 = (flattenedFields->builder).ptr;
            sVar13 = ((long)pRVar3 - (long)pRVar4 >> 3) * -0x590b21642c8590b2;
            if (pRVar3 == pRVar4) {
              sVar13 = 4;
            }
            kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::setCapacity
                      (flattenedFields,sVar13);
          }
          kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
          add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                    (&flattenedFields->builder,(FlattenedField *)local_3b8);
          DynamicValue::Reader::~Reader(&local_348);
          uVar10 = local_3b8._8_8_;
          uVar9 = local_3b8._0_8_;
          if (local_3b8._40_4_ - 1 < 2) {
            local_3b8._40_4_ = 0;
          }
          if ((RawBrandedSchema *)local_3b8._0_8_ != (RawBrandedSchema *)0x0) {
            local_3b8._0_8_ = (RawBrandedSchema *)0x0;
            local_3b8._8_8_ = (Schema)0x0;
            (***(_func_int ***)local_3b8._16_8_)(local_3b8._16_8_,uVar9,1,uVar10,uVar10,0);
          }
          DynamicValue::Reader::~Reader(&local_c0);
          if (local_228.tag - 1 < 2) {
            local_228.tag = 0;
          }
        }
        else {
          field_01._8_8_ = local_418.size_;
          field_01.parent.super_Schema.raw = (Schema)(Schema)local_418.ptr;
          field_01.proto._reader.segment = local_408.segment;
          field_01.proto._reader.capTable = local_408.capTable;
          field_01.proto._reader.data = local_408.data;
          field_01.proto._reader.pointers = local_408.pointers;
          field_01.proto._reader.dataSize = local_408.dataSize;
          field_01.proto._reader.pointerCount = local_408.pointerCount;
          field_01.proto._reader._38_2_ = local_408._38_2_;
          field_01.proto._reader.nestingLimit = local_408.nestingLimit;
          field_01.proto._reader._44_4_ = local_408._44_4_;
          DynamicStruct::Reader::get(&local_78,&local_260,field_01);
          prefix_04.content.size_ = sVar14;
          prefix_04.content.ptr = (char *)local_450;
          gatherForEncode(pAVar2,codec,&local_78,prefix_04,(StringPtr)(pFVar12->prefix).content,
                          flattenedFields);
          DynamicValue::Reader::~Reader(&local_78);
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)local_3b8,&local_260);
  pRVar6 = local_300;
  local_2f8[0] = local_3b8[0];
  if (local_3b8[0] != false) {
    local_2d0._4_4_ = local_3b8._44_4_;
    local_2d0._0_4_ = local_3b8._40_4_;
    local_2c0 = (uint16_t *)aStack_388._8_8_;
    uStack_2b8 = aStack_388._16_8_;
    uStack_2c8 = aStack_388._0_8_;
    local_2e0 = (SegmentReader *)local_3b8._24_8_;
    pCStack_2d8 = (CapTableReader *)local_3b8._32_8_;
    local_2f8._8_8_ = local_3b8._8_8_;
    pAStack_2e8 = (ArrayDisposer *)local_3b8._16_8_;
    pFVar12 = (this->fields).ptr + (local_3b8._16_8_ & 0xffffffff);
    if ((this->unionTagName).ptr.isSet == true) {
      local_1e0.tag = 2;
      local_1e0.field_1._0_4_ = 0xc;
      local_1e0.field_1._8_8_ = 0;
      local_418.ptr = (pFVar12->nameForDiscriminant).content.ptr;
      local_418.size_ = (pFVar12->nameForDiscriminant).content.size_;
      local_108.type = TEXT;
      prefix_03.content.size_ = sVar14;
      prefix_03.content.ptr = (char *)local_450;
      local_108.field_1.intValue = (int64_t)local_418.ptr;
      local_108.field_1.textValue.super_StringPtr.content.size_ = local_418.size_;
      FlattenedField::FlattenedField
                ((FlattenedField *)local_3b8,prefix_03,
                 (StringPtr)(this->unionTagName).ptr.field_1.value.content,&local_1e0,&local_108);
      pRVar3 = (flattenedFields->builder).pos;
      if (pRVar3 == (flattenedFields->builder).endPtr) {
        pRVar4 = (flattenedFields->builder).ptr;
        sVar13 = 4;
        if (pRVar3 != pRVar4) {
          sVar13 = ((long)pRVar3 - (long)pRVar4 >> 3) * -0x590b21642c8590b2;
        }
        kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::setCapacity
                  (flattenedFields,sVar13);
      }
      kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
      add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                (&flattenedFields->builder,(FlattenedField *)local_3b8);
      DynamicValue::Reader::~Reader(&local_348);
      uVar10 = local_3b8._8_8_;
      uVar9 = local_3b8._0_8_;
      if (local_3b8._40_4_ - 1 < 2) {
        local_3b8._40_4_ = 0;
      }
      if ((RawBrandedSchema *)local_3b8._0_8_ != (RawBrandedSchema *)0x0) {
        local_3b8._0_8_ = (RawBrandedSchema *)0x0;
        local_3b8._8_8_ = (Schema)0x0;
        (***(_func_int ***)local_3b8._16_8_)(local_3b8._16_8_,uVar9,1,uVar10,uVar10,0);
      }
      DynamicValue::Reader::~Reader(&local_108);
      if (local_1e0.tag - 1 < 2) {
        local_1e0.tag = 0;
      }
    }
    pAVar2 = (pFVar12->flattenHandler).ptr;
    if (pAVar2 == (AnnotatedHandler *)0x0) {
      TVar17 = StructSchema::Field::getType((Field *)(local_2f8 + 8));
      if ((((undefined1  [16])TVar17 & (undefined1  [16])0xffffff) != (undefined1  [16])0x0) ||
         (((this->unionTagName).ptr.isSet & 1U) == 0)) {
        AVar5 = (pFVar12->name).content;
        local_2b0.tag = 1;
        local_2b0.field_1._0_8_ = local_2f8._8_8_;
        local_2b0.field_1._8_8_ = pAStack_2e8;
        local_2b0.field_1._16_8_ = local_2e0;
        local_2b0.field_1._24_8_ = pCStack_2d8;
        local_2b0.field_1._32_4_ = (StructDataBitCount)local_2d0;
        local_2b0.field_1._36_2_ = local_2d0._4_2_;
        local_2b0.field_1.space[0x26] = local_2d0._6_1_;
        local_2b0.field_1.space[0x27] = local_2d0._7_1_;
        local_2b0.field_1._40_8_ = uStack_2c8;
        local_2b0.field_1._48_8_ = local_2c0;
        local_2b0.field_1._56_8_ = uStack_2b8;
        field_04._8_8_ = pAStack_2e8;
        field_04.parent.super_Schema.raw = (Schema)(Schema)local_2f8._8_8_;
        field_04.proto._reader.segment = local_2e0;
        field_04.proto._reader.capTable = pCStack_2d8;
        field_04.proto._reader.data = (void *)local_2d0;
        field_04.proto._reader.pointers = (WirePointer *)uStack_2c8;
        field_04.proto._reader._32_8_ = local_2c0;
        field_04.proto._reader._40_8_ = uStack_2b8;
        DynamicStruct::Reader::get(&local_150,&local_260,field_04);
        prefix_02.content.size_ = sVar14;
        prefix_02.content.ptr = (char *)local_450;
        FlattenedField::FlattenedField
                  ((FlattenedField *)local_3b8,prefix_02,(StringPtr)AVar5,&local_2b0,&local_150);
        pRVar3 = (flattenedFields->builder).pos;
        if (pRVar3 == (flattenedFields->builder).endPtr) {
          pRVar4 = (flattenedFields->builder).ptr;
          sVar14 = 4;
          if (pRVar3 != pRVar4) {
            sVar14 = ((long)pRVar3 - (long)pRVar4 >> 3) * -0x590b21642c8590b2;
          }
          kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::setCapacity
                    (flattenedFields,sVar14);
        }
        kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
        add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                  (&flattenedFields->builder,(FlattenedField *)local_3b8);
        DynamicValue::Reader::~Reader(&local_348);
        uVar10 = local_3b8._8_8_;
        uVar9 = local_3b8._0_8_;
        if (local_3b8._40_4_ - 1 < 2) {
          local_3b8._40_4_ = 0;
        }
        if ((RawBrandedSchema *)local_3b8._0_8_ != (RawBrandedSchema *)0x0) {
          local_3b8._0_8_ = (RawBrandedSchema *)0x0;
          local_3b8._8_8_ = (Schema)0x0;
          (***(_func_int ***)local_3b8._16_8_)(local_3b8._16_8_,uVar9,1,uVar10,uVar10,0);
        }
        DynamicValue::Reader::~Reader(&local_150);
        if (local_2b0.tag - 1 < 2) {
          local_2b0.tag = 0;
        }
      }
    }
    else {
      field_03._8_8_ = pAStack_2e8;
      field_03.parent.super_Schema.raw = (Schema)(Schema)local_2f8._8_8_;
      field_03.proto._reader.segment = local_2e0;
      field_03.proto._reader.capTable = pCStack_2d8;
      field_03.proto._reader.data = (void *)local_2d0;
      field_03.proto._reader.pointers = (WirePointer *)uStack_2c8;
      field_03.proto._reader._32_8_ = local_2c0;
      field_03.proto._reader._40_8_ = uStack_2b8;
      DynamicStruct::Reader::get(&local_198,&local_260,field_03);
      prefix_01.content.size_ = sVar14;
      prefix_01.content.ptr = (char *)local_450;
      gatherForEncode(pAVar2,codec,&local_198,prefix_01,(StringPtr)(pFVar12->prefix).content,
                      flattenedFields);
      DynamicValue::Reader::~Reader(&local_198);
    }
  }
  if (pRVar6 != (RawBrandedSchema *)0x0) {
    local_3d8 = (RawBrandedSchema *)0x0;
    SStack_3d0.raw = (RawBrandedSchema *)0x0;
    (**pAVar8->_vptr_ArrayDisposer)(pAVar8,pRVar6,1,SVar7.raw,SVar7.raw,0);
  }
  return;
}

Assistant:

void gatherForEncode(const JsonCodec& codec, DynamicValue::Reader input,
                       kj::StringPtr prefix, kj::StringPtr morePrefix,
                       kj::Vector<FlattenedField>& flattenedFields) const {
    kj::String ownPrefix;
    if (morePrefix.size() > 0) {
      if (prefix.size() > 0) {
        ownPrefix = kj::str(prefix, morePrefix);
        prefix = ownPrefix;
      } else {
        prefix = morePrefix;
      }
    }

    auto reader = input.as<DynamicStruct>();
    auto schema = reader.getSchema();
    for (auto field: schema.getNonUnionFields()) {
      auto& info = fields[field.getIndex()];
      if (!reader.has(field, codec.impl->hasMode)) {
        // skip
      } else KJ_IF_SOME(handler, info.flattenHandler) {
        handler.gatherForEncode(codec, reader.get(field), prefix, info.prefix, flattenedFields);
      } else {
        flattenedFields.add(FlattenedField {
            prefix, info.name, field, reader.get(field) });
      }
    }